

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O2

void __thiscall BS::thread_pool::~thread_pool(thread_pool *this)

{
  wait_for_tasks(this);
  destroy_threads(this);
  std::unique_ptr<std::thread[],_std::default_delete<std::thread[]>_>::~unique_ptr(&this->threads);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&(this->tasks).c);
  std::condition_variable::~condition_variable(&this->task_done_cv);
  std::condition_variable::~condition_variable(&this->task_available_cv);
  return;
}

Assistant:

~thread_pool()
    {
        wait_for_tasks();
        destroy_threads();
    }